

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

vector<Production_*,_std::allocator<Production_*>_> * __thiscall
CFG::removeDoubleProductions
          (vector<Production_*,_std::allocator<Production_*>_> *__return_storage_ptr__,CFG *this,
          vector<Production_*,_std::allocator<Production_*>_> *productions)

{
  bool bVar1;
  reference ppPVar2;
  Production *local_48;
  Production *prod;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  vector<Production_*,_std::allocator<Production_*>_> *productions_local;
  CFG *this_local;
  vector<Production_*,_std::allocator<Production_*>_> *newProductions;
  
  memset(__return_storage_ptr__,0,0x18);
  std::vector<Production_*,_std::allocator<Production_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(productions);
  prod = (Production *)std::vector<Production_*,_std::allocator<Production_*>_>::end(productions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                     *)&prod), bVar1) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    local_48 = *ppPVar2;
    bVar1 = inVector(local_48,__return_storage_ptr__);
    if (!bVar1) {
      std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                ((vector<Production*,std::allocator<Production*>> *)__return_storage_ptr__,&local_48
                );
    }
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Production *> CFG::removeDoubleProductions(std::vector<Production *> productions) {
    std::vector<Production *> newProductions = {};
    for (auto prod: productions) {
        if (!inVector(prod, newProductions)) {
            newProductions.emplace_back(prod);
        }
    }
    return newProductions;
}